

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth_pbuf.c
# Opt level: O2

csp_packet_t *
csp_eth_pbuf_new(csp_eth_interface_data_t *ifdata,uint32_t id,uint32_t now,int *task_woken)

{
  csp_packet_t *pcVar1;
  
  csp_eth_pbuf_cleanup(ifdata,now,task_woken);
  if (task_woken == (int *)0x0) {
    pcVar1 = csp_buffer_get(0);
  }
  else {
    pcVar1 = csp_buffer_get_isr(0);
  }
  if (pcVar1 != (csp_packet_t *)0x0) {
    (pcVar1->field_0).field_1.last_used = now;
    (pcVar1->field_0).field_0.timestamp_rx = id;
    (pcVar1->field_0).field_1.frame_length = 0;
    pcVar1->next = ifdata->pbufs;
    ifdata->pbufs = pcVar1;
  }
  return pcVar1;
}

Assistant:

csp_packet_t * csp_eth_pbuf_new(csp_eth_interface_data_t * ifdata, uint32_t id, uint32_t now, int * task_woken) {

	csp_eth_pbuf_cleanup(ifdata, now, task_woken);

	csp_packet_t * packet = (task_woken) ? csp_buffer_get_isr(0) : csp_buffer_get(0);
	if (packet == NULL) {
		return NULL;
	}

	packet->last_used = now;
	packet->cfpid = id;
	packet->frame_length = 0;

	/* Insert at beginning, because easy */
	packet->next = ifdata->pbufs;
	ifdata->pbufs = packet;

	return packet;
}